

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int termIsEquivalence(Parse *pParse,Expr *pExpr)

{
  byte bVar1;
  byte bVar2;
  Expr *pExpr_00;
  char cVar3;
  char cVar4;
  uint uVar5;
  CollSeq *pCVar6;
  CollSeq *pCVar7;
  long lVar8;
  int iVar9;
  
  iVar9 = 0;
  if (((pParse->db->dbOptFlags & 0x80) == 0) &&
     (((pExpr->op == '6' || (pExpr->op == '-')) && (iVar9 = 0, (pExpr->flags & 1) == 0)))) {
    cVar3 = sqlite3ExprAffinity(pExpr->pLeft);
    cVar4 = sqlite3ExprAffinity(pExpr->pRight);
    if ((cVar3 == cVar4) || ('B' < cVar4 && 'B' < cVar3)) {
      uVar5 = pExpr->flags & 0x400;
      pCVar6 = sqlite3BinaryCompareCollSeq
                         (pParse,*(Expr **)((long)&pExpr->pLeft + (ulong)(uVar5 >> 7)),
                          (&pExpr->pLeft)[uVar5 == 0]);
      iVar9 = 1;
      if ((pCVar6 != (CollSeq *)0x0) && (pCVar6->xCmp != binCollFunc)) {
        pExpr_00 = pExpr->pRight;
        pCVar6 = sqlite3ExprCollSeq(pParse,pExpr->pLeft);
        if (pCVar6 == (CollSeq *)0x0) {
          pCVar6 = pParse->db->pDfltColl;
        }
        pCVar7 = sqlite3ExprCollSeq(pParse,pExpr_00);
        if (pCVar7 == (CollSeq *)0x0) {
          pCVar7 = pParse->db->pDfltColl;
        }
        lVar8 = 0;
        do {
          bVar1 = pCVar6->zName[lVar8];
          bVar2 = pCVar7->zName[lVar8];
          if (bVar1 == bVar2) {
            if ((ulong)bVar1 == 0) goto LAB_001994cd;
          }
          else if (""[bVar1] != ""[bVar2]) {
LAB_001994cd:
            return (uint)(bVar1 == bVar2);
          }
          lVar8 = lVar8 + 1;
        } while( true );
      }
    }
  }
  return iVar9;
}

Assistant:

static int termIsEquivalence(Parse *pParse, Expr *pExpr){
  char aff1, aff2;
  CollSeq *pColl;
  if( !OptimizationEnabled(pParse->db, SQLITE_Transitive) ) return 0;
  if( pExpr->op!=TK_EQ && pExpr->op!=TK_IS ) return 0;
  if( ExprHasProperty(pExpr, EP_OuterON) ) return 0;
  aff1 = sqlite3ExprAffinity(pExpr->pLeft);
  aff2 = sqlite3ExprAffinity(pExpr->pRight);
  if( aff1!=aff2
   && (!sqlite3IsNumericAffinity(aff1) || !sqlite3IsNumericAffinity(aff2))
  ){
    return 0;
  }
  pColl = sqlite3ExprCompareCollSeq(pParse, pExpr);
  if( sqlite3IsBinary(pColl) ) return 1;
  return sqlite3ExprCollSeqMatch(pParse, pExpr->pLeft, pExpr->pRight);
}